

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

void __thiscall indk::Position::doAdd(Position *this,Position *P)

{
  uint uVar1;
  initializer_list<float> __l;
  uint uVar2;
  Error *pEVar3;
  float fVar4;
  allocator<float> local_59;
  float local_58;
  float local_54;
  iterator local_50;
  size_type local_48;
  vector<float,_std::allocator<float>_> local_40;
  uint local_28;
  uint i;
  Position *local_18;
  Position *P_local;
  Position *this_local;
  
  uVar1 = this->DimensionsCount;
  local_18 = P;
  P_local = this;
  uVar2 = getDimensionsCount(P);
  if (uVar1 != uVar2) {
    pEVar3 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(pEVar3,10);
    __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
  }
  uVar1 = this->Xm;
  uVar2 = getXm(local_18);
  if (uVar1 != uVar2) {
    pEVar3 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(pEVar3,9);
    __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
  }
  local_28 = 0;
  while( true ) {
    if (this->DimensionsCount <= local_28) {
      return;
    }
    fVar4 = getPositionValue(local_18,local_28);
    this->X[local_28] = this->X[local_28] + fVar4;
    if ((float)this->Xm < this->X[local_28]) break;
    local_28 = local_28 + 1;
  }
  pEVar3 = (Error *)__cxa_allocate_exception(0x28);
  local_58 = this->X[local_28];
  local_54 = (float)this->Xm;
  local_50 = &local_58;
  local_48 = 2;
  std::allocator<float>::allocator(&local_59);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<float,_std::allocator<float>_>::vector(&local_40,__l,&local_59);
  Error::Error(pEVar3,8,&local_40);
  __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
}

Assistant:

void indk::Position::doAdd(const indk::Position *P) {
    if (DimensionsCount != P->getDimensionsCount()) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
    }
    if (Xm != P->getXm()) {
        throw indk::Error(indk::Error::EX_POSITION_RANGES);
    }
    for (unsigned int i = 0; i < DimensionsCount; i++) {
        X[i] += P->getPositionValue(i);
        if (X[i] > Xm) {
            throw indk::Error(indk::Error::EX_POSITION_OUT_RANGES, {X[i], (float)Xm});
        }
    }
}